

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture.cpp
# Opt level: O3

bool __thiscall Texture::loadRGBA(Texture *this,string *path)

{
  pointer pcVar1;
  bool bVar2;
  string local_40;
  
  pcVar1 = (path->_M_dataplus)._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + path->_M_string_length);
  bVar2 = _loadTextureFromFile(this,&local_40,4,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return bVar2;
}

Assistant:

bool Texture::loadRGBA(std::string path) {
    return _loadTextureFromFile(path, STBI_rgb_alpha);
}